

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O2

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  double *pdVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  code *pcVar17;
  code *pcVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  double *pdVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  long local_120;
  double local_70;
  double local_68;
  
  puVar5 = (uint *)S->content;
  uVar1 = *puVar5;
  uVar2 = puVar5[2];
  uVar3 = puVar5[3];
  puVar6 = *(undefined8 **)(puVar5 + 0x18);
  lVar7 = *(long *)(puVar5 + 0x1a);
  lVar8 = *(long *)(puVar5 + 0x1c);
  lVar9 = *(long *)(puVar5 + 0x1e);
  uVar10 = *(undefined8 *)(puVar5 + 0x20);
  pdVar11 = *(double **)(puVar5 + 0x22);
  uVar12 = *(undefined8 *)(puVar5 + 0x24);
  lVar13 = *(long *)(puVar5 + 0x14);
  lVar14 = *(long *)(puVar5 + 0x16);
  uVar15 = *(undefined8 *)(puVar5 + 0xc);
  uVar16 = *(undefined8 *)(puVar5 + 0x12);
  pcVar17 = *(code **)(puVar5 + 10);
  pcVar18 = *(code **)(puVar5 + 0x10);
  puVar19 = *(undefined8 **)(puVar5 + 0x26);
  puVar20 = *(undefined8 **)(puVar5 + 0x28);
  puVar5[5] = 0;
  uVar4 = puVar5[1];
  if (puVar5[4] == 0) {
    iVar21 = (*pcVar17)(uVar15,x,uVar12);
    if (iVar21 != 0) {
      puVar5[4] = 0;
      iVar22 = 0x323;
      if (iVar21 < 0) {
        iVar22 = -0x325;
      }
      goto LAB_0013015c;
    }
    N_VLinearSum(0x3ff0000000000000,b,uVar12,uVar12);
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar12);
  }
  if (lVar13 == 0) {
    N_VScale(0x3ff0000000000000,uVar12,*puVar6);
  }
  else {
    N_VProd(lVar13,uVar12);
  }
  dVar33 = (double)N_VDotProd(*puVar6,*puVar6);
  dVar35 = 0.0;
  if (0.0 < dVar33) {
    if (dVar33 < 0.0) {
      dVar35 = sqrt(dVar33);
    }
    else {
      dVar35 = SQRT(dVar33);
    }
  }
  *(double *)(puVar5 + 6) = dVar35;
  if (dVar35 <= delta) {
    puVar5[4] = 0;
LAB_001300e2:
    iVar22 = 0;
  }
  else {
    uVar30 = (ulong)uVar1;
    N_VConst(0,uVar10);
    uVar32 = 0;
    uVar24 = 0;
    if (0 < (int)uVar1) {
      uVar24 = (ulong)uVar1;
    }
    dVar33 = dVar35;
    local_68 = dVar35;
    for (uVar23 = 0; local_120 = 4, (int)uVar23 <= (int)uVar3; uVar23 = uVar23 + 1) {
      for (lVar25 = 0; lVar25 <= (int)uVar1; lVar25 = lVar25 + 1) {
        for (uVar28 = 0; uVar30 != uVar28; uVar28 = uVar28 + 1) {
          *(undefined8 *)(*(long *)(lVar8 + lVar25 * 8) + uVar28 * 8) = 0;
        }
      }
      local_70 = 1.0;
      uVar28 = 0;
      dVar34 = dVar33;
      while (N_VScale(1.0 / dVar34,puVar6[uVar28],puVar6[uVar28]), uVar24 != uVar28) {
        puVar5[5] = puVar5[5] + 1;
        if (lVar14 == 0) {
          N_VScale(0x3ff0000000000000,puVar6[uVar28],uVar12);
        }
        else {
          N_VDiv(puVar6[uVar28],lVar14,uVar12);
        }
        if (uVar4 - 1 < 3) {
          N_VScale(0x3ff0000000000000,uVar12,puVar6[uVar28 + 1]);
          iVar21 = (*pcVar18)(delta,uVar16,puVar6[uVar28 + 1],uVar12,2);
          if (iVar21 == 0) goto LAB_0012fde1;
          puVar5[4] = 0;
          iVar27 = -0x328;
          iVar22 = 0x325;
LAB_00130154:
          if (iVar21 < 0) {
            iVar22 = iVar27;
          }
          goto LAB_0013015c;
        }
LAB_0012fde1:
        N_VScale(0x3ff0000000000000,uVar12,*(undefined8 *)(lVar7 + uVar28 * 8));
        iVar21 = (*pcVar17)(uVar15,uVar12,puVar6[uVar28 + 1]);
        if (iVar21 != 0) {
          puVar5[4] = 0;
          iVar27 = -0x325;
          iVar22 = 0x323;
          goto LAB_00130154;
        }
        if (lVar13 != 0) {
          N_VProd(lVar13,puVar6[uVar28 + 1]);
        }
        uVar32 = uVar28 + 1;
        lVar25 = *(long *)(lVar8 + 8 + uVar28 * 8) + local_120 + -4;
        if (uVar2 == 2) {
          SUNClassicalGS(puVar6,lVar8,uVar32 & 0xffffffff,uVar30,lVar25,puVar19,puVar20);
        }
        else {
          SUNModifiedGS(puVar6,lVar8,uVar32 & 0xffffffff,uVar30,lVar25);
        }
        iVar21 = SUNQRfact(uVar32 & 0xffffffff,lVar8,lVar9,uVar28 & 0xffffffff);
        if (iVar21 != 0) {
          puVar5[4] = 0;
          iVar22 = 0x327;
          goto LAB_0013015c;
        }
        local_70 = local_70 * *(double *)(lVar9 + local_120 * 2);
        local_68 = ABS(dVar33 * local_70);
        *(double *)(puVar5 + 6) = local_68;
        if (local_68 <= delta) {
          uVar32 = (ulong)((int)uVar28 + 1);
          break;
        }
        dVar34 = *(double *)(*(long *)(lVar8 + 8 + uVar28 * 8) + uVar28 * 8);
        local_120 = local_120 + 8;
        uVar28 = uVar32;
      }
      *pdVar11 = dVar33;
      iVar21 = (int)uVar32;
      uVar31 = 0;
      if (0 < iVar21) {
        uVar31 = uVar32 & 0xffffffff;
      }
      for (uVar26 = 0; uVar31 != uVar26; uVar26 = uVar26 + 1) {
        pdVar11[uVar26 + 1] = 0.0;
      }
      iVar22 = SUNQRsol(uVar32 & 0xffffffff,lVar8,lVar9);
      if (iVar22 != 0) {
        puVar5[4] = 0;
        iVar22 = -0x32b;
        goto LAB_0013015c;
      }
      *puVar19 = 0x3ff0000000000000;
      *puVar20 = uVar10;
      for (uVar26 = 0; uVar31 != uVar26; uVar26 = uVar26 + 1) {
        puVar19[uVar26 + 1] = pdVar11[uVar26];
        puVar20[uVar26 + 1] = *(undefined8 *)(lVar7 + uVar26 * 8);
      }
      N_VLinearCombination();
      if ((long)uVar28 < (long)(int)uVar1) {
        if (puVar5[4] == 0) {
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,x,uVar10);
        }
        else {
          N_VScale(uVar10,x);
        }
        puVar5[4] = 0;
        goto LAB_001300e2;
      }
      if (uVar23 == uVar3) break;
      uVar28 = uVar32 & 0xffffffff;
      pdVar29 = (double *)(uVar28 * 0x10 + lVar9 + -8);
      dVar34 = 1.0;
      for (; 0 < (int)uVar28; uVar28 = uVar28 - 1) {
        pdVar11[uVar28] = pdVar29[-1] * dVar34;
        dVar34 = dVar34 * *pdVar29;
        pdVar29 = pdVar29 + -2;
      }
      *pdVar11 = dVar34;
      for (lVar25 = 0; lVar25 <= iVar21; lVar25 = lVar25 + 1) {
        pdVar11[lVar25] = pdVar11[lVar25] * dVar33 * dVar34;
      }
      for (lVar25 = 0; lVar25 <= iVar21; lVar25 = lVar25 + 1) {
        puVar19[lVar25] = pdVar11[lVar25];
        puVar20[lVar25] = puVar6[lVar25];
      }
      dVar33 = ABS(dVar33 * dVar34);
      N_VLinearCombination(iVar21 + 1);
    }
    if (dVar35 <= local_68) {
      puVar5[4] = 0;
      iVar22 = 0x322;
    }
    else {
      if (puVar5[4] == 0) {
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,x,uVar10);
      }
      else {
        N_VScale(0x3ff0000000000000,uVar10,x);
      }
      puVar5[4] = 0;
      iVar22 = 0x321;
    }
  }
LAB_0013015c:
  *(int *)((long)S->content + 0x20) = iVar22;
  return iVar22;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnRight, scale1, scale2, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  int status;

  /* local shortcuts for fused vector operations */
  sunrealtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPFGMR_CONTENT(S)->zeroguess);
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnRight = ((SPFGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!preOnRight || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPFGMR", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }
    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l = 0; l < l_max; l++)
    {
      (*nli)++;

      krydim = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l + 1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l + 1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      SUNCheckLastErr();

      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      status = atimes(A_data, vtemp, V[l + 1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;
        return (LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)
      {
        N_VProd(s1, V[l + 1], V[l + 1]);
        SUNCheckLastErr();
      }

      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l])));
      }

      /* Update the QR factorization of Hes. */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return (LASTFLAG(S));
      }

      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                         "SUNLinSolSolve_SPFGMR", "iterate-residual",
                         "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE / Hes[l + 1][l], V[l + 1], V[l + 1]);
      SUNCheckLastErr();
    }

    /* Inner loop is done.  Compute the new correction vector xcor. */

    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return (LASTFLAG(S));
    }

    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = Z[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return. */
    if (converged)
    {
      if (*zeroguess)
      {
        N_VScale(ONE, xcor, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, xcor, x);
        SUNCheckLastErr();
      }
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;
      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    if (*zeroguess)
    {
      N_VScale(ONE, xcor, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, xcor, x);
      SUNCheckLastErr();
    }
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return (LASTFLAG(S));
}